

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3833::RotateReorderStiffnessMatrix
          (ChElementShellANCF_3833 *this,ChMatrixNM<double,_6,_6> *D,double theta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *pCVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  ChMatrixNM<double,_6,_6> K;
  ChMatrixNM<double,_6,_6> D_Reordered;
  double local_400;
  Scalar local_3d8;
  Scalar local_3d0;
  Scalar local_3c8;
  Scalar local_3c0;
  double local_3b8;
  double local_3b0;
  Scalar local_3a8;
  double local_3a0;
  Scalar local_398;
  Scalar local_390;
  Scalar local_388;
  Scalar local_380;
  Scalar local_378;
  double local_370;
  double local_368;
  Scalar local_360;
  Scalar local_358;
  Scalar local_350;
  Scalar local_348;
  Scalar local_340;
  Scalar local_338;
  Scalar local_330;
  Scalar local_328;
  Scalar local_320;
  double local_318;
  Scalar local_310;
  Scalar local_308;
  Scalar local_300;
  double local_2f8;
  double local_2f0;
  double local_2e8;
  Scalar local_2e0;
  Scalar local_2d8;
  Scalar local_2d0;
  double local_2c8;
  CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> local_2c0;
  CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> local_2a0 [9];
  Matrix<double,_6,_6,_1,_6,_6> local_180;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  local_2a0[0].m_row = 0;
  local_2a0[0].m_col = 1;
  local_2a0[0].m_currentBlockRows = 1;
  local_180.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0] =
       (D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0];
  local_2a0[0].m_xpr = &local_180;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (local_2a0,
                      (D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
                      m_data.array + 1);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 3);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 5);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 4);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 2);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 6);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 7);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 9);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 0xb);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 10);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 8);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 0x12);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 0x13);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 0x15);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 0x17);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 0x16);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 0x14);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 0x1e);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 0x1f);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 0x21);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 0x23);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 0x22);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 0x20);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 0x18);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 0x19);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 0x1b);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 0x1d);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 0x1c);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 0x1a);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 0xc);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 0xd);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 0xf);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 0x11);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).
                             m_storage.m_data.array + 0x10);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
            (pCVar3,(D->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
                    m_data.array + 0xe);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::finished(local_2a0);
  dVar5 = cos(theta);
  dVar6 = cos(theta);
  local_2a0[0].m_xpr = (Matrix<double,_6,_6,_1,_6,_6> *)(dVar6 * dVar5);
  local_2c0.m_row = 0;
  local_2c0.m_col = 1;
  local_2c0.m_currentBlockRows = 1;
  local_2c0.m_xpr = (Matrix<double,_6,_6,_1,_6,_6> *)local_2a0;
  dVar5 = sin(theta);
  local_2c8 = sin(theta);
  local_2c8 = local_2c8 * dVar5;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (&local_2c0,&local_2c8);
  local_2d0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_2d0);
  local_2d8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_2d8);
  local_2e0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_2e0);
  dVar5 = cos(theta);
  local_2e8 = sin(theta);
  local_2e8 = local_2e8 * (dVar5 + dVar5);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_2e8);
  dVar5 = sin(theta);
  local_2f0 = sin(theta);
  local_2f0 = local_2f0 * dVar5;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_2f0);
  dVar5 = cos(theta);
  local_2f8 = cos(theta);
  local_2f8 = local_2f8 * dVar5;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_2f8);
  local_300 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_300);
  local_308 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_308);
  local_310 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_310);
  dVar5 = cos(theta);
  local_318 = sin(theta);
  local_318 = local_318 * dVar5 * -2.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_318);
  local_320 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_320);
  local_328 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_328);
  local_330 = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_330);
  local_338 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_338);
  local_340 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_340);
  local_348 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_348);
  local_350 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_350);
  local_358 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_358);
  local_360 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_360);
  local_368 = cos(theta);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_368);
  local_370 = sin(theta);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_370);
  local_378 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_378);
  local_380 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_380);
  local_388 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_388);
  local_390 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_390);
  auVar10._0_8_ = sin(theta);
  auVar10._8_56_ = extraout_var;
  auVar1._8_8_ = 0x8000000000000000;
  auVar1._0_8_ = 0x8000000000000000;
  auVar4 = vxorpd_avx512vl(auVar10._0_16_,auVar1);
  local_398 = (Scalar)vmovlpd_avx(auVar4);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_398);
  local_3a0 = cos(theta);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_3a0);
  local_3a8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_3a8);
  auVar11._0_8_ = cos(theta);
  auVar11._8_56_ = extraout_var_00;
  auVar2._8_8_ = 0x8000000000000000;
  auVar2._0_8_ = 0x8000000000000000;
  auVar4 = vxorpd_avx512vl(auVar11._0_16_,auVar2);
  local_3b0 = sin(theta);
  local_400 = auVar4._0_8_;
  local_3b0 = local_3b0 * local_400;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_3b0);
  dVar5 = cos(theta);
  local_3b8 = sin(theta);
  local_3b8 = local_3b8 * dVar5;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_3b8);
  local_3c0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_3c0);
  local_3c8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_3c8);
  local_3d0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_
                     (pCVar3,&local_3d0);
  dVar5 = cos(theta);
  dVar6 = cos(theta);
  dVar7 = sin(theta);
  dVar8 = sin(theta);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar6;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dVar5;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar8 * dVar7;
  auVar4 = vfmsub231sd_fma(auVar9,auVar12,auVar4);
  local_3d8 = auVar4._0_8_;
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::operator_(pCVar3,&local_3d8);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::finished(&local_2c0);
  local_2c0.m_xpr = (Matrix<double,_6,_6,_1,_6,_6> *)local_2a0;
  local_2c0.m_row = (Index)&local_180;
  local_2c0.m_col = (Index)local_2a0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::Transpose<Eigen::Matrix<double,6,6,1,6,6>>,0>>
            (D,(Product<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>,_0>
                *)&local_2c0);
  return;
}

Assistant:

void ChElementShellANCF_3833::RotateReorderStiffnessMatrix(ChMatrixNM<double, 6, 6>& D, double theta) {
    // Reorder the stiffness matrix from the order assumed in ChMaterialShellANCF.h
    //  E = [E11,E22,2*E12,E33,2*E13,2*E23]
    // to the order assumed in this element formulation
    //  E = [E11,E22,E33,2*E23,2*E13,2*E12]
    // Note that the 6x6 stiffness matrix is symmetric

    ChMatrixNM<double, 6, 6> D_Reordered;
    D_Reordered << D(0, 0), D(0, 1), D(0, 3), D(0, 5), D(0, 4), D(0, 2), D(1, 0), D(1, 1), D(1, 3), D(1, 5), D(1, 4),
        D(1, 2), D(3, 0), D(3, 1), D(3, 3), D(3, 5), D(3, 4), D(3, 2), D(5, 0), D(5, 1), D(5, 3), D(5, 5), D(5, 4),
        D(5, 2), D(4, 0), D(4, 1), D(4, 3), D(4, 5), D(4, 4), D(4, 2), D(2, 0), D(2, 1), D(2, 3), D(2, 5), D(2, 4),
        D(2, 2);

    // Stiffness Tensor Rotation Matrix From:
    // http://solidmechanics.org/text/Chapter3_2/Chapter3_2.htm

    ChMatrixNM<double, 6, 6> K;
    K << std::cos(theta) * std::cos(theta), std::sin(theta) * std::sin(theta), 0, 0, 0,
        2 * std::cos(theta) * std::sin(theta), std::sin(theta) * std::sin(theta), std::cos(theta) * std::cos(theta), 0,
        0, 0, -2 * std::cos(theta) * std::sin(theta), 0, 0, 1, 0, 0, 0, 0, 0, 0, std::cos(theta), std::sin(theta), 0, 0,
        0, 0, -std::sin(theta), std::cos(theta), 0, -std::cos(theta) * std::sin(theta),
        std::cos(theta) * std::sin(theta), 0, 0, 0,
        std::cos(theta) * std::cos(theta) - std::sin(theta) * std::sin(theta);

    D = K * D_Reordered * K.transpose();
}